

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec3 __thiscall djb::microfacet::u2_to_s2(microfacet *this,vec2 *u,vec3 *wi,void *user_args)

{
  vec3 vVar1;
  vec3 local_a0;
  vec3 local_90;
  undefined1 local_84 [8];
  args args;
  void *user_args_local;
  vec3 *wi_local;
  vec2 *u_local;
  microfacet *this_local;
  
  args._68_8_ = user_args;
  if (user_args == (void *)0x0) {
    microfacet::args::standard();
  }
  else {
    memcpy(local_84,user_args,0x4c);
  }
  vVar1 = u2_to_h2(this,u,wi,(args *)local_84);
  local_a0.z = vVar1.z;
  local_90.z = local_a0.z;
  local_a0._0_8_ = vVar1._0_8_;
  local_90.x = local_a0.x;
  local_90.y = local_a0.y;
  vVar1 = h2_to_s2(this,&local_90,wi);
  return vVar1;
}

Assistant:

vec3
microfacet::u2_to_s2(const vec2 &u, const vec3 &wi, const void *user_args) const
{
	//DJB_ASSERT(wi.z >= 0 && "invalid incident direction");
	microfacet::args args =
		user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
		          : microfacet::args::standard();

	return h2_to_s2(u2_to_h2(u, wi, args), wi);
}